

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> __thiscall
fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>
          (detail *this,back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,
          basic_string_view<char16_t> s,basic_format_specs<char16_t> *specs)

{
  type tVar1;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar2;
  char16_t *n;
  size_t extraout_RDX;
  basic_string_view<char16_t> s_00;
  basic_string_view<char16_t> s_01;
  size_t local_88;
  anon_class_16_2_3f014a30 local_80;
  size_t local_70;
  basic_string_view<char16_t> local_68;
  size_t local_58;
  size_t width;
  char16_t *local_48;
  ulong local_40;
  size_t size;
  char16_t *data;
  basic_format_specs<char16_t> *specs_local;
  basic_string_view<char16_t> s_local;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out_local;
  
  n = (char16_t *)s.size_;
  s_local.data_ = s.data_;
  data = n;
  specs_local = (basic_format_specs<char16_t> *)out.container;
  s_local.size_ = (size_t)this;
  size = (size_t)basic_string_view<char16_t>::data((basic_string_view<char16_t> *)&specs_local);
  local_40 = basic_string_view<char16_t>::size((basic_string_view<char16_t> *)&specs_local);
  if (-1 < *(int *)(data + 2)) {
    tVar1 = to_unsigned<int>(*(int *)(data + 2));
    if (tVar1 < local_40) {
      width = (size_t)specs_local;
      local_48 = s_local.data_;
      tVar1 = to_unsigned<int>(*(int *)(data + 2));
      s_00.size_._0_4_ = tVar1;
      s_00.data_ = local_48;
      s_00.size_._4_4_ = 0;
      local_40 = code_point_index<char16_t>((detail *)width,s_00,(size_t)n);
    }
  }
  if (*(int *)data == 0) {
    local_88 = 0;
  }
  else {
    basic_string_view<char16_t>::basic_string_view(&local_68,(char16_t *)size,local_40);
    s_01.size_ = extraout_RDX;
    s_01.data_ = (char16_t *)local_68.size_;
    local_88 = compute_width<char16_t>((detail *)local_68.data_,s_01);
  }
  local_58 = local_88;
  local_70 = s_local.size_;
  local_80.data = (char16_t *)size;
  local_80.size = local_40;
  bVar2 = write_padded<(fmt::v8::align::type)1,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::write<char16_t,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::basic_string_view<char16_t>,fmt::v8::basic_format_specs<char16_t>const&)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_>
                    ((back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)s_local.size_,
                     (basic_format_specs<char16_t> *)data,local_40,local_88,&local_80);
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar2.container;
}

Assistant:

FMT_CONSTEXPR auto write(OutputIt out, basic_string_view<Char> s,
                         const basic_format_specs<Char>& specs) -> OutputIt {
  auto data = s.data();
  auto size = s.size();
  if (specs.precision >= 0 && to_unsigned(specs.precision) < size)
    size = code_point_index(s, to_unsigned(specs.precision));
  auto width =
      specs.width != 0 ? compute_width(basic_string_view<Char>(data, size)) : 0;
  return write_padded(out, specs, size, width,
                      [=](reserve_iterator<OutputIt> it) {
                        return copy_str<Char>(data, data + size, it);
                      });
}